

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup3.c
# Opt level: O2

void hashlittle2(void *key,size_t length,uint32_t *pc,uint32_t *pb)

{
  uint uVar1;
  int iVar2;
  byte *pbVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  
  uVar4 = (int)length + *pc + 0xdeadbeef;
  uVar1 = *pb + uVar4;
  uVar5 = uVar4;
  if (((ulong)key & 3) == 0) {
LAB_001112e8:
    switch(length) {
    case 0:
      goto switchD_0011147f_caseD_0;
    case 1:
      uVar6 = (uint)(byte)*key;
      goto LAB_0011154f;
    case 2:
      uVar6 = (uint)(ushort)*key;
      goto LAB_0011154f;
    case 3:
      uVar6 = *key & 0xffffff;
      goto LAB_0011154f;
    case 4:
      goto switchD_0011136c_caseD_4;
    case 5:
      uVar6 = (uint)(byte)*(uint *)((long)key + 4);
      break;
    case 6:
      uVar6 = (uint)(ushort)*(uint *)((long)key + 4);
      break;
    case 7:
      uVar6 = *(uint *)((long)key + 4) & 0xffffff;
      break;
    case 8:
      goto switchD_0011136c_caseD_8;
    case 9:
      uVar6 = (uint)(byte)*(uint *)((long)key + 8);
      goto LAB_00111546;
    case 10:
      uVar6 = (uint)(ushort)*(uint *)((long)key + 8);
      goto LAB_00111546;
    case 0xb:
      uVar6 = *(uint *)((long)key + 8) & 0xffffff;
LAB_00111546:
      uVar1 = uVar1 + uVar6;
switchD_0011136c_caseD_8:
      uVar4 = uVar4 + *(uint *)((long)key + 4);
      goto switchD_0011136c_caseD_4;
    case 0xc:
      uVar1 = uVar1 + *(uint *)((long)key + 8);
      goto switchD_0011136c_caseD_8;
    default:
      goto switchD_0011136c_default;
    }
    uVar4 = uVar4 + uVar6;
switchD_0011136c_caseD_4:
    uVar6 = *key;
    goto LAB_0011154f;
  }
  if (((ulong)key & 1) != 0) {
    pbVar3 = (byte *)((long)key + 0xb);
LAB_0011137e:
    switch(length) {
    case 0:
      goto switchD_0011147f_caseD_0;
    case 0xc:
      uVar1 = uVar1 + (uint)*pbVar3 * 0x1000000;
    case 0xb:
      uVar1 = uVar1 + (uint)pbVar3[-1] * 0x10000;
    case 10:
      uVar1 = uVar1 + (uint)pbVar3[-2] * 0x100;
    case 9:
      uVar1 = uVar1 + pbVar3[-3];
    case 8:
      uVar4 = uVar4 + (uint)pbVar3[-4] * 0x1000000;
    case 7:
      uVar4 = uVar4 + (uint)pbVar3[-5] * 0x10000;
    case 6:
      uVar4 = uVar4 + (uint)pbVar3[-6] * 0x100;
    case 5:
      uVar4 = uVar4 + pbVar3[-7];
    case 4:
      uVar5 = uVar5 + (uint)pbVar3[-8] * 0x1000000;
    case 3:
      uVar5 = uVar5 + (uint)pbVar3[-9] * 0x10000;
    case 2:
      uVar5 = uVar5 + (uint)pbVar3[-10] * 0x100;
    case 1:
      uVar6 = (uint)pbVar3[-0xb];
LAB_0011154f:
      uVar6 = uVar6 + uVar5;
      goto LAB_001115a0;
    default:
      goto switchD_00111497_default;
    }
  }
LAB_0011126b:
  switch(length) {
  case 0:
    goto switchD_0011147f_caseD_0;
  case 1:
    uVar6 = (uint)(byte)*key;
    goto LAB_00111581;
  case 2:
    goto switchD_0011147f_caseD_2;
  case 3:
    uVar5 = uVar5 + (uint)(byte)*(ushort *)((long)key + 2) * 0x10000;
    goto switchD_0011147f_caseD_2;
  case 4:
    goto switchD_0011147f_caseD_4;
  case 5:
    uVar6 = (uint)(byte)*(ushort *)((long)key + 4);
    goto LAB_0011159a;
  case 6:
    goto switchD_0011147f_caseD_6;
  case 7:
    uVar4 = uVar4 + (uint)(byte)*(ushort *)((long)key + 6) * 0x10000;
    goto switchD_0011147f_caseD_6;
  case 8:
    break;
  case 9:
    uVar6 = (uint)(byte)*(ushort *)((long)key + 8);
    goto LAB_0011156c;
  case 10:
    goto switchD_0011147f_caseD_a;
  case 0xb:
    uVar1 = uVar1 + (uint)(byte)*(ushort *)((long)key + 10) * 0x10000;
    goto switchD_0011147f_caseD_a;
  case 0xc:
    uVar1 = uVar1 + *(int *)((long)key + 8);
    break;
  default:
    goto switchD_0011147f_default;
  }
switchD_0011147f_caseD_8:
  uVar4 = uVar4 + *(int *)((long)key + 4);
switchD_0011147f_caseD_4:
  uVar6 = uVar5 + *key;
LAB_001115a0:
  uVar1 = (uVar1 ^ uVar4) - (uVar4 << 0xe | uVar4 >> 0x12);
  uVar8 = (uVar6 ^ uVar1) - (uVar1 * 0x800 | uVar1 >> 0x15);
  uVar6 = (uVar4 ^ uVar8) - (uVar8 * 0x2000000 | uVar8 >> 7);
  uVar1 = (uVar1 ^ uVar6) - (uVar6 * 0x10000 | uVar6 >> 0x10);
  uVar8 = (uVar8 ^ uVar1) - (uVar1 * 0x10 | uVar1 >> 0x1c);
  uVar4 = (uVar6 ^ uVar8) - (uVar8 * 0x4000 | uVar8 >> 0x12);
  uVar1 = (uVar1 ^ uVar4) - (uVar4 * 0x1000000 | uVar4 >> 8);
switchD_0011147f_caseD_0:
  *pc = uVar1;
  *pb = uVar4;
  return;
switchD_0011136c_default:
  uVar1 = uVar1 + *(uint *)((long)key + 8);
  uVar6 = (uVar1 * 0x10 | uVar1 >> 0x1c) ^ (uVar5 + *key) - uVar1;
  iVar2 = uVar1 + uVar4 + *(uint *)((long)key + 4);
  uVar8 = (uVar6 << 6 | uVar6 >> 0x1a) ^ (uVar4 + *(uint *)((long)key + 4)) - uVar6;
  iVar7 = uVar6 + iVar2;
  uVar1 = (uVar8 << 8 | uVar8 >> 0x18) ^ iVar2 - uVar8;
  iVar9 = uVar8 + iVar7;
  uVar8 = (uVar1 << 0x10 | uVar1 >> 0x10) ^ iVar7 - uVar1;
  iVar2 = uVar1 + iVar9;
  uVar6 = (uVar8 << 0x13 | uVar8 >> 0xd) ^ iVar9 - uVar8;
  uVar5 = uVar8 + iVar2;
  uVar1 = (uVar6 << 4 | uVar6 >> 0x1c) ^ iVar2 - uVar6;
  uVar4 = uVar6 + uVar5;
  length = length - 0xc;
  key = (void *)((long)key + 0xc);
  goto LAB_001112e8;
switchD_00111497_default:
  iVar2 = (uint)pbVar3[-4] * 0x1000000 + (uint)pbVar3[-5] * 0x10000 +
          (uint)pbVar3[-6] * 0x100 + uVar4 + pbVar3[-7];
  uVar6 = (uint)*pbVar3 * 0x1000000 + (uint)pbVar3[-1] * 0x10000 +
          (uint)pbVar3[-2] * 0x100 + uVar1 + pbVar3[-3];
  uVar1 = (uVar6 * 0x10 | uVar6 >> 0x1c) ^
          ((uint)pbVar3[-8] * 0x1000000 + (uint)pbVar3[-9] * 0x10000 +
          (uint)pbVar3[-10] * 0x100 + uVar5 + pbVar3[-0xb]) - uVar6;
  iVar7 = uVar6 + iVar2;
  uVar6 = (uVar1 << 6 | uVar1 >> 0x1a) ^ iVar2 - uVar1;
  iVar2 = uVar1 + iVar7;
  uVar1 = (uVar6 << 8 | uVar6 >> 0x18) ^ iVar7 - uVar6;
  iVar7 = uVar6 + iVar2;
  uVar8 = (uVar1 << 0x10 | uVar1 >> 0x10) ^ iVar2 - uVar1;
  iVar2 = uVar1 + iVar7;
  uVar6 = (uVar8 << 0x13 | uVar8 >> 0xd) ^ iVar7 - uVar8;
  uVar5 = uVar8 + iVar2;
  uVar1 = (uVar6 << 4 | uVar6 >> 0x1c) ^ iVar2 - uVar6;
  uVar4 = uVar6 + uVar5;
  length = length - 0xc;
  pbVar3 = pbVar3 + 0xc;
  goto LAB_0011137e;
switchD_0011147f_default:
  uVar1 = uVar1 + *(int *)((long)key + 8);
  uVar6 = (uVar1 * 0x10 | uVar1 >> 0x1c) ^ (uVar5 + *key) - uVar1;
  iVar2 = uVar1 + uVar4 + *(int *)((long)key + 4);
  uVar8 = (uVar6 << 6 | uVar6 >> 0x1a) ^ (uVar4 + *(int *)((long)key + 4)) - uVar6;
  iVar7 = uVar6 + iVar2;
  uVar1 = (uVar8 << 8 | uVar8 >> 0x18) ^ iVar2 - uVar8;
  iVar9 = uVar8 + iVar7;
  uVar8 = (uVar1 << 0x10 | uVar1 >> 0x10) ^ iVar7 - uVar1;
  iVar2 = uVar1 + iVar9;
  uVar6 = (uVar8 << 0x13 | uVar8 >> 0xd) ^ iVar9 - uVar8;
  uVar5 = uVar8 + iVar2;
  uVar1 = (uVar6 << 4 | uVar6 >> 0x1c) ^ iVar2 - uVar6;
  uVar4 = uVar6 + uVar5;
  length = length - 0xc;
  key = (void *)((long)key + 0xc);
  goto LAB_0011126b;
switchD_0011147f_caseD_a:
  uVar6 = (uint)*(ushort *)((long)key + 8);
LAB_0011156c:
  uVar1 = uVar1 + uVar6;
  goto switchD_0011147f_caseD_8;
switchD_0011147f_caseD_6:
  uVar6 = (uint)*(ushort *)((long)key + 4);
LAB_0011159a:
  uVar4 = uVar4 + uVar6;
  goto switchD_0011147f_caseD_4;
switchD_0011147f_caseD_2:
  uVar6 = (uint)*key;
LAB_00111581:
  uVar6 = uVar5 + uVar6;
  goto LAB_001115a0;
}

Assistant:

void hashlittle2(
  const void *key,       /* the key to hash */
  size_t      length,    /* length of the key */
  uint32_t   *pc,        /* IN: primary initval, OUT: primary hash */
  uint32_t   *pb)        /* IN: secondary initval, OUT: secondary hash */
{
  uint32_t a,b,c;                                          /* internal state */
  union { const void *ptr; size_t i; } u;     /* needed for Mac Powerbook G4 */

  /* Set up the internal state */
  a = b = c = 0xdeadbeef + ((uint32_t)length) + *pc;
  c += *pb;

  u.ptr = key;
  if (HASH_LITTLE_ENDIAN && ((u.i & 0x3) == 0)) {
    const uint32_t *k = (const uint32_t *)key;         /* read 32-bit chunks */
    const uint8_t  *k8;

    /*------ all but last block: aligned reads and affect 32 bits of (a,b,c) */
    while (length > 12)
    {
      a += k[0];
      b += k[1];
      c += k[2];
      mix(a,b,c);
      length -= 12;
      k += 3;
    }

    /*----------------------------- handle the last (probably partial) block */
    /*
     * "k[2]&0xffffff" actually reads beyond the end of the string, but
     * then masks off the part it's not allowed to read.  Because the
     * string is aligned, the masked-off tail is in the same word as the
     * rest of the string.  Every machine with memory protection I've seen
     * does it on word boundaries, so is OK with this.  But VALGRIND will
     * still catch it and complain.  The masking trick does make the hash
     * noticably faster for short strings (like English words).
     */
#ifndef VALGRIND

    switch(length)
    {
    case 12: c+=k[2]; b+=k[1]; a+=k[0]; break;
    case 11: c+=k[2]&0xffffff; b+=k[1]; a+=k[0]; break;
    case 10: c+=k[2]&0xffff; b+=k[1]; a+=k[0]; break;
    case 9 : c+=k[2]&0xff; b+=k[1]; a+=k[0]; break;
    case 8 : b+=k[1]; a+=k[0]; break;
    case 7 : b+=k[1]&0xffffff; a+=k[0]; break;
    case 6 : b+=k[1]&0xffff; a+=k[0]; break;
    case 5 : b+=k[1]&0xff; a+=k[0]; break;
    case 4 : a+=k[0]; break;
    case 3 : a+=k[0]&0xffffff; break;
    case 2 : a+=k[0]&0xffff; break;
    case 1 : a+=k[0]&0xff; break;
    case 0 : *pc=c; *pb=b; return;  /* zero length strings require no mixing */
    }

#else /* make valgrind happy */

    k8 = (const uint8_t *)k;
    switch(length)
    {
    case 12: c+=k[2]; b+=k[1]; a+=k[0]; break;
    case 11: c+=((uint32_t)k8[10])<<16;  /* fall through */
    case 10: c+=((uint32_t)k8[9])<<8;    /* fall through */
    case 9 : c+=k8[8];                   /* fall through */
    case 8 : b+=k[1]; a+=k[0]; break;
    case 7 : b+=((uint32_t)k8[6])<<16;   /* fall through */
    case 6 : b+=((uint32_t)k8[5])<<8;    /* fall through */
    case 5 : b+=k8[4];                   /* fall through */
    case 4 : a+=k[0]; break;
    case 3 : a+=((uint32_t)k8[2])<<16;   /* fall through */
    case 2 : a+=((uint32_t)k8[1])<<8;    /* fall through */
    case 1 : a+=k8[0]; break;
    case 0 : *pc=c; *pb=b; return;  /* zero length strings require no mixing */
    }

#endif /* !valgrind */

  } else if (HASH_LITTLE_ENDIAN && ((u.i & 0x1) == 0)) {
    const uint16_t *k = (const uint16_t *)key;         /* read 16-bit chunks */
    const uint8_t  *k8;

    /*--------------- all but last block: aligned reads and different mixing */
    while (length > 12)
    {
      a += k[0] + (((uint32_t)k[1])<<16);
      b += k[2] + (((uint32_t)k[3])<<16);
      c += k[4] + (((uint32_t)k[5])<<16);
      mix(a,b,c);
      length -= 12;
      k += 6;
    }

    /*----------------------------- handle the last (probably partial) block */
    k8 = (const uint8_t *)k;
    switch(length)
    {
    case 12: c+=k[4]+(((uint32_t)k[5])<<16);
             b+=k[2]+(((uint32_t)k[3])<<16);
             a+=k[0]+(((uint32_t)k[1])<<16);
             break;
    case 11: c+=((uint32_t)k8[10])<<16;     /* fall through */
    case 10: c+=k[4];
             b+=k[2]+(((uint32_t)k[3])<<16);
             a+=k[0]+(((uint32_t)k[1])<<16);
             break;
    case 9 : c+=k8[8];                      /* fall through */
    case 8 : b+=k[2]+(((uint32_t)k[3])<<16);
             a+=k[0]+(((uint32_t)k[1])<<16);
             break;
    case 7 : b+=((uint32_t)k8[6])<<16;      /* fall through */
    case 6 : b+=k[2];
             a+=k[0]+(((uint32_t)k[1])<<16);
             break;
    case 5 : b+=k8[4];                      /* fall through */
    case 4 : a+=k[0]+(((uint32_t)k[1])<<16);
             break;
    case 3 : a+=((uint32_t)k8[2])<<16;      /* fall through */
    case 2 : a+=k[0];
             break;
    case 1 : a+=k8[0];
             break;
    case 0 : *pc=c; *pb=b; return;  /* zero length strings require no mixing */
    }

  } else {                        /* need to read the key one byte at a time */
    const uint8_t *k = (const uint8_t *)key;

    /*--------------- all but the last block: affect some 32 bits of (a,b,c) */
    while (length > 12)
    {
      a += k[0];
      a += ((uint32_t)k[1])<<8;
      a += ((uint32_t)k[2])<<16;
      a += ((uint32_t)k[3])<<24;
      b += k[4];
      b += ((uint32_t)k[5])<<8;
      b += ((uint32_t)k[6])<<16;
      b += ((uint32_t)k[7])<<24;
      c += k[8];
      c += ((uint32_t)k[9])<<8;
      c += ((uint32_t)k[10])<<16;
      c += ((uint32_t)k[11])<<24;
      mix(a,b,c);
      length -= 12;
      k += 12;
    }

    /*-------------------------------- last block: affect all 32 bits of (c) */
    switch(length)                   /* all the case statements fall through */
    {
    case 12: c+=((uint32_t)k[11])<<24;
    case 11: c+=((uint32_t)k[10])<<16;
    case 10: c+=((uint32_t)k[9])<<8;
    case 9 : c+=k[8];
    case 8 : b+=((uint32_t)k[7])<<24;
    case 7 : b+=((uint32_t)k[6])<<16;
    case 6 : b+=((uint32_t)k[5])<<8;
    case 5 : b+=k[4];
    case 4 : a+=((uint32_t)k[3])<<24;
    case 3 : a+=((uint32_t)k[2])<<16;
    case 2 : a+=((uint32_t)k[1])<<8;
    case 1 : a+=k[0];
             break;
    case 0 : *pc=c; *pb=b; return;  /* zero length strings require no mixing */
    }
  }

  final(a,b,c);
  *pc=c; *pb=b;
}